

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O3

void google::protobuf::MapTestUtil::SetMapFields<proto2_unittest::TestMap>(TestMap *message)

{
  MapField<proto2_unittest::TestMap_MapStringStringEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *this;
  MapField<proto2_unittest::TestMap_MapInt32BytesEntry_DoNotUse,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
  *this_00;
  Map<int,int> *pMVar1;
  Map<long,_long> *pMVar2;
  Map<unsigned_int,_unsigned_int> *pMVar3;
  Map<unsigned_long,_unsigned_long> *pMVar4;
  Map<int,_float> *pMVar5;
  Map<int,_double> *pMVar6;
  Map<bool,_bool> *pMVar7;
  Map<std::__cxx11::string,std::__cxx11::string> *pMVar8;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar9
  ;
  Map<int,_proto2_unittest::MapEnum> *pMVar10;
  Map<int,_proto2_unittest::ForeignMessage> *pMVar11;
  MapField<proto2_unittest::TestMap_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_01;
  size_type __dnew;
  undefined8 local_110;
  NodeBase *local_108;
  NodeBase *local_100 [2];
  pair<google::protobuf::Map<int,_int>::iterator,_bool> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum> *local_b0;
  TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  TypeDefinedMapFieldBase<bool,_bool> *local_98;
  TypeDefinedMapFieldBase<int,_double> *local_90;
  TypeDefinedMapFieldBase<int,_float> *local_88;
  TypeDefinedMapFieldBase<long,_long> *local_80;
  TypeDefinedMapFieldBase<int,_int> *local_78;
  TypeDefinedMapFieldBase<unsigned_long,_unsigned_long> *local_70;
  TypeDefinedMapFieldBase<unsigned_int,_unsigned_int> *local_68;
  TypeDefinedMapFieldBase<long,_long> *local_60;
  TypeDefinedMapFieldBase<int,_int> *local_58;
  TypeDefinedMapFieldBase<unsigned_long,_unsigned_long> *local_50;
  TypeDefinedMapFieldBase<unsigned_int,_unsigned_int> *local_48;
  TypeDefinedMapFieldBase<long,_long> *local_40;
  TypeDefinedMapFieldBase<int,_int> *local_38;
  
  local_38 = (TypeDefinedMapFieldBase<int,_int> *)&message->field_0;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_38);
  local_110 = (NodeBase **)((ulong)local_110._4_4_ << 0x20);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_40 = &(message->field_0)._impl_.map_int64_int64_.super_TypeDefinedMapFieldBase<long,_long>;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_40);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_48 = &(message->field_0)._impl_.map_uint32_uint32_.
              super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>;
  pMVar3 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (local_48);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             pMVar3,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_50 = &(message->field_0)._impl_.map_uint64_uint64_.
              super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>;
  pMVar4 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap
                     (local_50);
  local_110 = (NodeBase **)0x0;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             pMVar4,&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_58 = &(message->field_0)._impl_.map_sint32_sint32_.super_TypeDefinedMapFieldBase<int,_int>;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_58);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_60 = &(message->field_0)._impl_.map_sint64_sint64_.super_TypeDefinedMapFieldBase<long,_long>
  ;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_60);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_68 = &(message->field_0)._impl_.map_fixed32_fixed32_.
              super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>;
  pMVar3 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (local_68);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             pMVar3,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_70 = &(message->field_0)._impl_.map_fixed64_fixed64_.
              super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>;
  pMVar4 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap
                     (local_70);
  local_110 = (NodeBase **)0x0;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             pMVar4,&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_78 = &(message->field_0)._impl_.map_sfixed32_sfixed32_.
              super_TypeDefinedMapFieldBase<int,_int>;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_78);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_80 = &(message->field_0)._impl_.map_sfixed64_sfixed64_.
              super_TypeDefinedMapFieldBase<long,_long>;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_80);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_88 = &(message->field_0)._impl_.map_int32_float_.super_TypeDefinedMapFieldBase<int,_float>;
  pMVar5 = protobuf::internal::TypeDefinedMapFieldBase<int,_float>::MutableMap(local_88);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,float>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_float>::iterator,_bool> *)&local_f0,pMVar5,
             (int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_90 = &(message->field_0)._impl_.map_int32_double_.super_TypeDefinedMapFieldBase<int,_double>
  ;
  pMVar6 = protobuf::internal::TypeDefinedMapFieldBase<int,_double>::MutableMap(local_90);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,double>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_double>::iterator,_bool> *)&local_f0,pMVar6,
             (int *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_98 = &(message->field_0)._impl_.map_bool_bool_.super_TypeDefinedMapFieldBase<bool,_bool>;
  pMVar7 = protobuf::internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap(local_98);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffffffffff00);
  Map<bool,bool>::TryEmplaceInternal<bool_const&>
            ((pair<google::protobuf::Map<bool,_bool>::iterator,_bool> *)&local_f0,pMVar7,
             (bool *)&local_110);
  *(undefined1 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 1) = 0;
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create(&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x6c20797265762061;
  local_110[2] = (NodeBase *)0x6972747320676e6f;
  local_110[3] = (NodeBase *)0x207461687420676e;
  local_110[4] = (NodeBase *)0x206e692073656f67;
  local_110[5] = (NodeBase *)0x7061656820656874;
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  this = &(message->field_0)._impl_.map_string_string_;
  pMVar8 = (Map<std::__cxx11::string,std::__cxx11::string> *)
           protobuf::internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap(&this->
                         super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       );
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_f0);
  local_d0.field_2._M_allocated_capacity = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  builtin_strncpy(local_d0._M_dataplus._M_p,"This is a very long string that goes in the heap",0x30)
  ;
  local_d0._M_string_length = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  local_d0._M_dataplus._M_p[(long)local_f0.first.super_UntypedMapIterator.node_] = '\0';
  Map<std::__cxx11::string,std::__cxx11::string>::TryEmplaceInternal<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pMVar8,&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 5),(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create(&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x6c20797265762061;
  local_110[2] = (NodeBase *)0x6972747320676e6f;
  local_110[3] = (NodeBase *)0x207461687420676e;
  local_110[4] = (NodeBase *)0x206e692073656f67;
  local_110[5] = (NodeBase *)0x7061656820656874;
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  this_00 = &(message->field_0)._impl_.map_int32_bytes_;
  pMVar9 = protobuf::internal::
           TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap(&this_00->
                         super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       );
  local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffff00000000;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pMVar9,(int *)&local_d0);
  local_a8 = &this_00->
              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  local_a0 = &this->
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 2),(string *)&local_110);
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_b0 = &(message->field_0)._impl_.map_int32_enum_.
              super_TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>;
  pMVar10 = protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>::MutableMap
                      (local_b0);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,proto2_unittest::MapEnum>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::MapEnum>::iterator,_bool> *)&local_f0
             ,pMVar10,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  this_01 = &(message->field_0)._impl_.map_int32_foreign_message_;
  pMVar11 = protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>::
            MutableMap(&this_01->super_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>
                      );
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,proto2_unittest::ForeignMessage>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::ForeignMessage>::iterator,_bool> *)
             &local_f0,pMVar11,(int *)&local_110);
  *(undefined4 *)&local_f0.first.super_UntypedMapIterator.node_[5].next = 0;
  *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next =
       *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next | 1;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_38);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_40);
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  pMVar3 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (local_48);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             pMVar3,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  pMVar4 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap
                     (local_50);
  local_110 = (NodeBase **)0x1;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             pMVar4,&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_58);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_60);
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  pMVar3 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (local_68);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             pMVar3,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  pMVar4 = protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap
                     (local_70);
  local_110 = (NodeBase **)0x1;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             pMVar4,&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  pMVar1 = (Map<int,int> *)
           protobuf::internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_78);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,pMVar1,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  pMVar2 = protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_80);
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,pMVar2,&local_110)
  ;
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  pMVar5 = protobuf::internal::TypeDefinedMapFieldBase<int,_float>::MutableMap(local_88);
  local_110._0_4_ = 1;
  Map<int,float>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_float>::iterator,_bool> *)&local_f0,pMVar5,
             (int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0x3f800000;
  pMVar6 = protobuf::internal::TypeDefinedMapFieldBase<int,_double>::MutableMap(local_90);
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,double>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_double>::iterator,_bool> *)&local_f0,pMVar6,
             (int *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)&DAT_3ff0000000000000;
  pMVar7 = protobuf::internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap(local_98);
  local_110 = (NodeBase **)CONCAT71(local_110._1_7_,1);
  Map<bool,bool>::TryEmplaceInternal<bool_const&>
            ((pair<google::protobuf::Map<bool,_bool>::iterator,_bool> *)&local_f0,pMVar7,
             (bool *)&local_110);
  *(undefined1 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 1) = 1;
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create(&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x20726568746f6e61;
  local_110[2] = (NodeBase *)0x6e6f6c2079726576;
  local_110[3] = (NodeBase *)0x676e697274732067;
  local_110[4] = (NodeBase *)0x6f67207461687420;
  local_110[5] = (NodeBase *)0x6874206e69207365;
  builtin_strncpy((char *)((long)local_110 + 0x2e),"the heap",8);
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  pMVar8 = (Map<std::__cxx11::string,std::__cxx11::string> *)
           protobuf::internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap(local_a0);
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_f0);
  local_d0.field_2._M_allocated_capacity = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  builtin_strncpy(local_d0._M_dataplus._M_p,"This is another very long string that goes in the heap"
                  ,0x36);
  local_d0._M_string_length = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  local_d0._M_dataplus._M_p[(long)local_f0.first.super_UntypedMapIterator.node_] = '\0';
  Map<std::__cxx11::string,std::__cxx11::string>::TryEmplaceInternal<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pMVar8,&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 5),(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create(&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x20726568746f6e61;
  local_110[2] = (NodeBase *)0x6e6f6c2079726576;
  local_110[3] = (NodeBase *)0x676e697274732067;
  local_110[4] = (NodeBase *)0x6f67207461687420;
  local_110[5] = (NodeBase *)0x6874206e69207365;
  builtin_strncpy((char *)((long)local_110 + 0x2e),"the heap",8);
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  pMVar9 = protobuf::internal::
           TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap(local_a8);
  local_d0._M_dataplus._M_p._0_4_ = 1;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pMVar9,(int *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 2),(string *)&local_110);
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  pMVar10 = protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>::MutableMap
                      (local_b0);
  local_110._0_4_ = 1;
  Map<int,proto2_unittest::MapEnum>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::MapEnum>::iterator,_bool> *)&local_f0
             ,pMVar10,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 2;
  pMVar11 = protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>::
            MutableMap(&this_01->super_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>
                      );
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,proto2_unittest::ForeignMessage>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::ForeignMessage>::iterator,_bool> *)
             &local_f0,pMVar11,(int *)&local_110);
  *(undefined4 *)&local_f0.first.super_UntypedMapIterator.node_[5].next = 1;
  *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next =
       *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next | 1;
  return;
}

Assistant:

void MapTestUtil::SetMapFields(TestMap* message) {
  // Add first element.
  (*message->mutable_map_int32_int32())[0] = 0;
  (*message->mutable_map_int64_int64())[0] = 0;
  (*message->mutable_map_uint32_uint32())[0] = 0;
  (*message->mutable_map_uint64_uint64())[0] = 0;
  (*message->mutable_map_sint32_sint32())[0] = 0;
  (*message->mutable_map_sint64_sint64())[0] = 0;
  (*message->mutable_map_fixed32_fixed32())[0] = 0;
  (*message->mutable_map_fixed64_fixed64())[0] = 0;
  (*message->mutable_map_sfixed32_sfixed32())[0] = 0;
  (*message->mutable_map_sfixed64_sfixed64())[0] = 0;
  (*message->mutable_map_int32_float())[0] = 0.0;
  (*message->mutable_map_int32_double())[0] = 0.0;
  (*message->mutable_map_bool_bool())[0] = false;
  (*message->mutable_map_string_string())[long_string()] = long_string();
  (*message->mutable_map_int32_bytes())[0] = long_string();
  (*message->mutable_map_int32_enum())[0] = MapEnum_BAR<TestMap>();
  (*message->mutable_map_int32_foreign_message())[0].set_c(0);

  // Add second element
  (*message->mutable_map_int32_int32())[1] = 1;
  (*message->mutable_map_int64_int64())[1] = 1;
  (*message->mutable_map_uint32_uint32())[1] = 1;
  (*message->mutable_map_uint64_uint64())[1] = 1;
  (*message->mutable_map_sint32_sint32())[1] = 1;
  (*message->mutable_map_sint64_sint64())[1] = 1;
  (*message->mutable_map_fixed32_fixed32())[1] = 1;
  (*message->mutable_map_fixed64_fixed64())[1] = 1;
  (*message->mutable_map_sfixed32_sfixed32())[1] = 1;
  (*message->mutable_map_sfixed64_sfixed64())[1] = 1;
  (*message->mutable_map_int32_float())[1] = 1.0;
  (*message->mutable_map_int32_double())[1] = 1.0;
  (*message->mutable_map_bool_bool())[1] = true;
  (*message->mutable_map_string_string())[long_string_2()] = long_string_2();
  (*message->mutable_map_int32_bytes())[1] = long_string_2();
  (*message->mutable_map_int32_enum())[1] = MapEnum_BAZ<TestMap>();
  (*message->mutable_map_int32_foreign_message())[1].set_c(1);
}